

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

int luaK_code(FuncState *fs,Instruction i)

{
  Proto *pPVar1;
  Instruction *pIVar2;
  int *piVar3;
  int iVar4;
  SharedProto *pSVar5;
  
  pPVar1 = fs->f;
  patchlistaux(fs,fs->jpc,fs->pc,0xff,fs->pc);
  fs->jpc = -1;
  iVar4 = fs->pc;
  pSVar5 = pPVar1->sp;
  if (iVar4 < pSVar5->sizecode) {
    pIVar2 = pSVar5->code;
  }
  else {
    pIVar2 = (Instruction *)
             luaM_growaux_(fs->ls->L,pSVar5->code,&pSVar5->sizecode,4,0x7fffffff,"opcodes");
    pSVar5 = pPVar1->sp;
    pSVar5->code = pIVar2;
    iVar4 = fs->pc;
  }
  pIVar2[iVar4] = i;
  iVar4 = fs->pc;
  if (iVar4 < pSVar5->sizelineinfo) {
    piVar3 = pSVar5->lineinfo;
  }
  else {
    piVar3 = (int *)luaM_growaux_(fs->ls->L,pSVar5->lineinfo,&pSVar5->sizelineinfo,4,0x7fffffff,
                                  "opcodes");
    pPVar1->sp->lineinfo = piVar3;
    iVar4 = fs->pc;
  }
  piVar3[iVar4] = fs->ls->lastline;
  iVar4 = fs->pc;
  fs->pc = iVar4 + 1;
  return iVar4;
}

Assistant:

static int luaK_code (FuncState *fs, Instruction i) {
  Proto *f = fs->f;
  dischargejpc(fs);  /* 'pc' will change */
  /* put new instruction in code array */
  luaM_growvector(fs->ls->L, f->sp->code, fs->pc, f->sp->sizecode, Instruction,
                  MAX_INT, "opcodes");
  f->sp->code[fs->pc] = i;
  /* save corresponding line information */
  luaM_growvector(fs->ls->L, f->sp->lineinfo, fs->pc, f->sp->sizelineinfo, int,
                  MAX_INT, "opcodes");
  f->sp->lineinfo[fs->pc] = fs->ls->lastline;
  return fs->pc++;
}